

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

Own<kj::LocalPeerIdentity,_std::nullptr_t> __thiscall
kj::LocalPeerIdentity::newInstance(LocalPeerIdentity *this,Credentials *creds)

{
  bool bVar1;
  bool bVar2;
  anon_union_4_1_a8c68091_for_NullableValue<int>_2 aVar3;
  anon_union_4_1_a8c68091_for_NullableValue<unsigned_int>_2 aVar4;
  _func_int **pp_Var5;
  undefined8 extraout_RDX;
  Own<kj::LocalPeerIdentity,_std::nullptr_t> OVar6;
  
  pp_Var5 = (_func_int **)operator_new(0x18);
  bVar1 = (creds->pid).ptr.isSet;
  aVar3 = (creds->pid).ptr.field_1;
  bVar2 = (creds->uid).ptr.isSet;
  OVar6.ptr._1_7_ = (undefined7)((ulong)extraout_RDX >> 8);
  OVar6.ptr._0_1_ = bVar2;
  aVar4 = (creds->uid).ptr.field_1;
  *pp_Var5 = (_func_int *)&PTR_toString_00677300;
  *(bool *)(pp_Var5 + 1) = bVar1;
  if (bVar1 == true) {
    *(anon_union_4_1_a8c68091_for_NullableValue<int>_2 *)((long)pp_Var5 + 0xc) = aVar3;
  }
  *(bool *)(pp_Var5 + 2) = bVar2;
  if (bVar2 != false) {
    *(anon_union_4_1_a8c68091_for_NullableValue<unsigned_int>_2 *)((long)pp_Var5 + 0x14) = aVar4;
  }
  (this->super_PeerIdentity)._vptr_PeerIdentity =
       (_func_int **)
       &kj::_::HeapDisposer<kj::(anonymous_namespace)::LocalPeerIdentityImpl>::instance;
  this[1].super_PeerIdentity._vptr_PeerIdentity = pp_Var5;
  OVar6.disposer = (Disposer *)this;
  return OVar6;
}

Assistant:

kj::Own<LocalPeerIdentity> LocalPeerIdentity::newInstance(LocalPeerIdentity::Credentials creds) {
  return kj::heap<LocalPeerIdentityImpl>(creds);
}